

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall icu_63::UnicodeSet::findCodePoint(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  piVar2 = this->list;
  uVar4 = 0;
  if (*piVar2 <= c) {
    iVar1 = this->len;
    uVar4 = iVar1 - 1;
    if ((1 < (long)iVar1) && (c < piVar2[(long)iVar1 + -2])) {
      uVar3 = uVar4;
      uVar5 = 0;
      while (uVar4 = uVar3, uVar6 = uVar4 + uVar5 >> 1, uVar6 != uVar5) {
        uVar3 = uVar6;
        if (piVar2[uVar6] <= c) {
          uVar3 = uVar4;
          uVar5 = uVar6;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int32_t UnicodeSet::findCodePoint(UChar32 c) const {
    /* Examples:
                                       findCodePoint(c)
       set              list[]         c=0 1 3 4 7 8
       ===              ==============   ===========
       []               [110000]         0 0 0 0 0 0
       [\u0000-\u0003]  [0, 4, 110000]   1 1 1 2 2 2
       [\u0004-\u0007]  [4, 8, 110000]   0 0 0 1 1 2
       [:Any:]          [0, 110000]      1 1 1 1 1 1
     */

    // Return the smallest i such that c < list[i].  Assume
    // list[len - 1] == HIGH and that c is legal (0..HIGH-1).
    if (c < list[0])
        return 0;
    // High runner test.  c is often after the last range, so an
    // initial check for this condition pays off.
    int32_t lo = 0;
    int32_t hi = len - 1;
    if (lo >= hi || c >= list[hi-1])
        return hi;
    // invariant: c >= list[lo]
    // invariant: c < list[hi]
    for (;;) {
        int32_t i = (lo + hi) >> 1;
        if (i == lo) {
            break; // Found!
        } else if (c < list[i]) {
            hi = i;
        } else {
            lo = i;
        }
    }
    return hi;
}